

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O1

bool __thiscall
glcts::PipelineStatisticsQueryTestFunctional3::executeTest
          (PipelineStatisticsQueryTestFunctional3 *this,GLenum current_query_target)

{
  _primitive_type *primitive_type_ptr;
  _draw_call_type *draw_call_type_ptr;
  ostringstream *this_00;
  Context *pCVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  GLenum err;
  deUint32 err_00;
  undefined4 extraout_var;
  _primitive_type _Var5;
  GLenum value;
  char *msg;
  _draw_call_type draw_call;
  long lVar6;
  uint n_expected_values;
  undefined4 uStack_284;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  long local_268;
  ulong local_260;
  _test_execution_result run_result;
  uint index_data [7];
  GLuint64 expected_values [4];
  ios_base local_180 [264];
  float vertex_data [16];
  Functions *gl;
  
  iVar4 = (*((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  run_result.result_qo_int = 0x7fffffff;
  run_result.result_qo_int64 = 0x7fffffffffffffff;
  run_result.result_qo_uint = 0xffffffff;
  run_result.result_qo_uint64 = 0xffffffffffffffff;
  run_result.result_int = 0x7fffffff;
  run_result.result_int64 = 0x7fffffffffffffff;
  run_result.result_uint = 0xffffffff;
  run_result.result_uint64 = 0xffffffffffffffff;
  run_result.int64_written = false;
  run_result.uint64_written = false;
  vertex_data[0xc] = -0.3;
  vertex_data[0xd] = 0.3;
  vertex_data[0xe] = -0.5;
  vertex_data[0xf] = -0.5;
  vertex_data[8] = 0.0;
  vertex_data[9] = 0.0;
  vertex_data[10] = -0.6;
  vertex_data[0xb] = -0.9;
  vertex_data[4] = 0.2;
  vertex_data[5] = -0.7;
  vertex_data[6] = 0.5;
  vertex_data[7] = -0.5;
  vertex_data[0] = -0.1;
  vertex_data[1] = 0.2;
  vertex_data[2] = 0.3;
  vertex_data[3] = 0.1;
  index_data[4] = 3;
  index_data[5] = 5;
  index_data[6] = 4;
  index_data[0] = 0;
  index_data[1] = 6;
  index_data[2] = 2;
  index_data[3] = 1;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_baseinstance_argument
       = 1;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_basevertex_argument =
       0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_count_argument = 7;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_first_argument = 0;
  (this->super_PipelineStatisticsQueryTestFunctionalBase).m_indirect_draw_call_primcount_argument =
       3;
  lVar6 = 0;
  PipelineStatisticsQueryTestFunctionalBase::initVBO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,vertex_data,0x40,index_data,0x1c
             ,7,3,1,0,0);
  PipelineStatisticsQueryTestFunctionalBase::initVAO
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,2);
  local_260 = (ulong)(current_query_target == 0x82f7);
  primitive_type_ptr =
       &(this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_primitive_type;
  draw_call_type_ptr =
       &(this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_draw_call_type;
  bVar3 = true;
  do {
    bVar2 = (bool)(&DAT_01af216c)[lVar6];
    this->m_is_primitive_restart_enabled = bVar2;
    local_268 = lVar6;
    if (((current_query_target & 0xfffffffe) != 0x82f6) || (bVar2 == false)) {
      if (bVar2 == false) {
        (*gl->disable)(0x8f9d);
        err_00 = (*gl->getError)();
        msg = "glDisable() call failed.";
        iVar4 = 0xbcf;
      }
      else {
        (*gl->primitiveRestartIndex)(0);
        err = (*gl->getError)();
        glu::checkError(err,"glPrimitiveRestartIndex() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                        ,0xbd4);
        (*gl->enable)(0x8f9d);
        err_00 = (*gl->getError)();
        msg = "glEnable() call failed.";
        iVar4 = 0xbd7;
      }
      glu::checkError(err_00,msg,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                      ,iVar4);
      _Var5 = PRIMITIVE_TYPE_FIRST;
      do {
        *primitive_type_ptr = _Var5;
        if (_Var5 != PRIMITIVE_TYPE_PATCHES) {
          draw_call = (uint)this->m_is_primitive_restart_enabled << 2;
          do {
            *draw_call_type_ptr = draw_call;
            bVar2 = PipelineStatisticsQueryUtilities::isDrawCallSupported(draw_call,gl);
            if (bVar2) {
              pCVar1 = (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                       m_context;
              bVar2 = PipelineStatisticsQueryUtilities::executeQuery
                                (current_query_target,
                                 (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id,
                                 (this->super_PipelineStatisticsQueryTestFunctionalBase).m_bo_qo_id,
                                 PipelineStatisticsQueryTestFunctionalBase::
                                 queryCallbackDrawCallHandler,this,pCVar1->m_renderCtx,
                                 (this->super_PipelineStatisticsQueryTestFunctionalBase).
                                 super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                                 pCVar1->m_contextInfo,&run_result);
              if (bVar2) {
                expected_values[2] = 0;
                expected_values[3] = 0;
                expected_values[0] = 0;
                expected_values[1] = 0;
                n_expected_values = 0;
                if (current_query_target == 0x82ee) {
                  getExpectedVerticesSubmittedQueryResult
                            (this,*primitive_type_ptr,&n_expected_values,expected_values);
                }
                else {
                  getExpectedPrimitivesSubmittedQueryResult
                            (this,*primitive_type_ptr,&n_expected_values,expected_values);
                }
                bVar2 = PipelineStatisticsQueryUtilities::verifyResultValues
                                  (&run_result,n_expected_values,expected_values,
                                   (this->super_PipelineStatisticsQueryTestFunctionalBase).m_qo_id
                                   != 0,current_query_target,draw_call_type_ptr,primitive_type_ptr,
                                   this->m_is_primitive_restart_enabled,
                                   (this->super_PipelineStatisticsQueryTestFunctionalBase).
                                   super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                                   (_verification_type)local_260);
                bVar3 = (bool)(bVar2 & bVar3);
              }
              else {
                expected_values[0] =
                     (GLuint64)
                     ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                      super_TestCase.super_TestNode.m_testCtx)->m_log;
                this_00 = (ostringstream *)(expected_values + 1);
                std::__cxx11::ostringstream::ostringstream(this_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00,
                           "Could not retrieve test run results for query target [",0x36);
                PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
                          ((string *)&n_expected_values,
                           (PipelineStatisticsQueryUtilities *)(ulong)current_query_target,value);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00,(char *)CONCAT44(uStack_284,n_expected_values),
                           local_280);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)expected_values,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_284,n_expected_values) != &local_278) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(uStack_284,n_expected_values),
                                  local_278._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream(this_00);
                std::ios_base::~ios_base(local_180);
                bVar3 = false;
              }
            }
            draw_call = draw_call + DRAW_CALL_TYPE_GLDRAWARRAYSINDIRECT;
          } while (draw_call != DRAW_CALL_TYPE_COUNT);
        }
        _Var5 = _Var5 + PRIMITIVE_TYPE_LINE_LOOP;
      } while (_Var5 != PRIMITIVE_TYPE_COUNT);
    }
    lVar6 = local_268 + 1;
  } while (local_268 == 0);
  return bVar3;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional3::executeTest(glw::GLenum current_query_target)
{
	const glw::Functions&									 gl		= m_context.getRenderContext().getFunctions();
	bool													 result = true;
	PipelineStatisticsQueryUtilities::_test_execution_result run_result;

	/* Sanity check: This method should only be called for GL_VERTICES_SUBMITTED_ARB,
	 * GL_PRIMITIVES_SUBMITTED_ARB, GL_CLIPPING_INPUT_PRIMITIVES_ARB and
	 * GL_CLIPPING_OUTPUT_PRIMITIVES_ARB queries */
	DE_ASSERT(current_query_target == GL_VERTICES_SUBMITTED_ARB ||
			  current_query_target == GL_PRIMITIVES_SUBMITTED_ARB ||
			  current_query_target == GL_CLIPPING_INPUT_PRIMITIVES_ARB ||
			  current_query_target == GL_CLIPPING_OUTPUT_PRIMITIVES_ARB);

	/* Set up VBO. We don't really care much about the visual outcome,
	 * so any data will do.
	 */
	const unsigned int n_vertex_components = 2;
	const float		   vertex_data[]	   = { -0.1f, 0.2f, 0.3f,  0.1f,  0.2f,  -0.7f, 0.5f,  -0.5f,
								  0.0f,  0.0f, -0.6f, -0.9f, -0.3f, 0.3f,  -0.5f, -0.5f };
	const unsigned int index_data[] = {
		0, 6, 2, 1, 3, 5, 4,
	};
	const unsigned int n_indices = sizeof(index_data) / sizeof(index_data[0]);

	m_indirect_draw_call_baseinstance_argument = 1;
	m_indirect_draw_call_basevertex_argument   = 0;
	m_indirect_draw_call_count_argument		   = n_indices;
	m_indirect_draw_call_first_argument		   = 0;
	m_indirect_draw_call_primcount_argument	= 3;

	initVBO(vertex_data, sizeof(vertex_data), index_data, sizeof(index_data), m_indirect_draw_call_count_argument,
			m_indirect_draw_call_primcount_argument, m_indirect_draw_call_baseinstance_argument,
			m_indirect_draw_call_first_argument, m_indirect_draw_call_basevertex_argument);

	initVAO(n_vertex_components);

	/* Verify that the query works correctly both when primitive restart functionality
	 * is disabled and enabled */
	const bool		   pr_statuses[] = { false, true };
	const unsigned int n_pr_statuses = sizeof(pr_statuses) / sizeof(pr_statuses[0]);

	for (unsigned int n_pr_status = 0; n_pr_status < n_pr_statuses; ++n_pr_status)
	{
		m_is_primitive_restart_enabled = pr_statuses[n_pr_status];

		/* Primitive restart should never be enabled for GL_CLIPPING_INPUT_PRIMITIVES_ARB query. */
		if ((current_query_target == GL_CLIPPING_INPUT_PRIMITIVES_ARB ||
			 current_query_target == GL_CLIPPING_OUTPUT_PRIMITIVES_ARB) &&
			m_is_primitive_restart_enabled)
		{
			continue;
		}

		/* Configure 'primitive restart' functionality */
		if (!m_is_primitive_restart_enabled)
		{
			gl.disable(GL_PRIMITIVE_RESTART);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable() call failed.");
		}
		else
		{
			gl.primitiveRestartIndex(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glPrimitiveRestartIndex() call failed.");

			gl.enable(GL_PRIMITIVE_RESTART);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call failed.");
		}

		/* Iterate through all primitive types */
		for (unsigned int n_primitive_type = 0;
			 n_primitive_type < PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_COUNT; ++n_primitive_type)
		{
			m_current_primitive_type = (PipelineStatisticsQueryUtilities::_primitive_type)n_primitive_type;

			/* Exclude patches from the test */
			if (m_current_primitive_type == PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_PATCHES)
			{
				continue;
			}

			/* Iterate through all draw call types while the query is enabled (skip DrawArrays calls if primitive restart is enabled) */
			for (unsigned int n_draw_call_type =
					 (m_is_primitive_restart_enabled ? PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_GLDRAWELEMENTS :
													   0);
				 n_draw_call_type < PipelineStatisticsQueryUtilities::DRAW_CALL_TYPE_COUNT; ++n_draw_call_type)
			{
				m_current_draw_call_type = (PipelineStatisticsQueryUtilities::_draw_call_type)n_draw_call_type;

				/* Only continue if the draw call is supported by the context */
				if (!PipelineStatisticsQueryUtilities::isDrawCallSupported(m_current_draw_call_type, gl))
				{
					continue;
				}

				if (!PipelineStatisticsQueryUtilities::executeQuery(
						current_query_target, m_qo_id, m_bo_qo_id, queryCallbackDrawCallHandler,
						(PipelineStatisticsQueryTestFunctionalBase*)this, m_context.getRenderContext(), m_testCtx,
						m_context.getContextInfo(), &run_result))
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Could not retrieve test run results for query target "
										  "["
									   << PipelineStatisticsQueryUtilities::getStringForEnum(current_query_target)
									   << "]" << tcu::TestLog::EndMessage;

					result = false;
				}
				else
				{
					glw::GLuint64										 expected_values[4] = { 0 };
					unsigned int										 n_expected_values  = 0;
					PipelineStatisticsQueryUtilities::_verification_type verification_type =
						PipelineStatisticsQueryUtilities::VERIFICATION_TYPE_EXACT_MATCH;

					if (current_query_target == GL_CLIPPING_OUTPUT_PRIMITIVES_ARB)
					{
						verification_type = PipelineStatisticsQueryUtilities::VERIFICATION_TYPE_EQUAL_OR_GREATER;
					}

					if (current_query_target == GL_VERTICES_SUBMITTED_ARB)
					{
						getExpectedVerticesSubmittedQueryResult(m_current_primitive_type, &n_expected_values,
																expected_values);
					}
					else
					{
						getExpectedPrimitivesSubmittedQueryResult(m_current_primitive_type, &n_expected_values,
																  expected_values);
					}

					result &= PipelineStatisticsQueryUtilities::verifyResultValues(
						run_result, n_expected_values, expected_values, m_qo_id != 0, /* should_check_qo_bo_values */
						current_query_target, &m_current_draw_call_type, &m_current_primitive_type,
						m_is_primitive_restart_enabled, m_testCtx, verification_type);

				} /* if (run results were obtained successfully) */
			}	 /* for (all draw call types) */
		}		  /* for (all primitive types) */
	}			  /* for (both when primitive restart is disabled and enabled) */

	return result;
}